

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

int Acb_NtkComputeLevelD(Acb_Ntk_t *p,Vec_Int_t *vTfo)

{
  int iVar1;
  int local_24;
  int Level;
  int iObj;
  int i;
  Vec_Int_t *vTfo_local;
  Acb_Ntk_t *p_local;
  
  local_24 = 0;
  iVar1 = Acb_NtkHasObjLevelD(p);
  if (iVar1 == 0) {
    Acb_NtkCleanObjLevelD(p);
  }
  Level = Vec_IntSize(vTfo);
  while (Level = Level + -1, -1 < Level) {
    iVar1 = Vec_IntEntry(vTfo,Level);
    Acb_ObjComputeLevelD(p,iVar1);
  }
  for (Level = 0; iVar1 = Acb_NtkCoNum(p), Level < iVar1; Level = Level + 1) {
    iVar1 = Acb_NtkCo(p,Level);
    iVar1 = Acb_ObjLevelD(p,iVar1);
    local_24 = Abc_MaxInt(local_24,iVar1);
  }
  p->LevelMax = local_24;
  return local_24;
}

Assistant:

int Acb_NtkComputeLevelD( Acb_Ntk_t * p, Vec_Int_t * vTfo )
{
    // it is assumed that vTfo contains CO nodes and level of new nodes was already updated
    int i, iObj, Level = 0;
    if ( !Acb_NtkHasObjLevelD( p ) )
        Acb_NtkCleanObjLevelD( p );
    Vec_IntForEachEntryReverse( vTfo, iObj, i )
        Acb_ObjComputeLevelD( p, iObj );
    Acb_NtkForEachCo( p, iObj, i )
        Level = Abc_MaxInt( Level, Acb_ObjLevelD(p, iObj) );
    p->LevelMax = Level;
    return Level;
}